

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void Imf_3_4::anon_unknown_1::insertChannels(Header *header,RgbaChannels rgbaChannels)

{
  ChannelList *pCVar1;
  uint in_ESI;
  ChannelList ch;
  Channel *in_stack_000001e0;
  char *in_stack_000001e8;
  ChannelList *in_stack_000001f0;
  ChannelList *in_stack_ffffffffffffff40;
  Channel local_ac;
  Channel local_9c;
  Channel local_8c;
  Channel local_7c;
  Channel local_6c;
  Channel local_50 [4];
  uint local_c;
  
  local_c = in_ESI;
  ChannelList::ChannelList((ChannelList *)0x21ef63);
  if ((local_c & 0x30) == 0) {
    if ((local_c & 1) != 0) {
      Channel::Channel(&local_8c,HALF,1,1,false);
      ChannelList::insert(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
    }
    if ((local_c & 2) != 0) {
      Channel::Channel(&local_9c,HALF,1,1,false);
      ChannelList::insert(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
    }
    if ((local_c & 4) != 0) {
      Channel::Channel(&local_ac,HALF,1,1,false);
      ChannelList::insert(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
    }
  }
  else {
    if ((local_c & 0x10) != 0) {
      Channel::Channel(local_50,HALF,1,1,false);
      ChannelList::insert(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
    }
    if ((local_c & 0x20) != 0) {
      Channel::Channel(&local_6c,HALF,2,2,true);
      ChannelList::insert(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
      Channel::Channel(&local_7c,HALF,2,2,true);
      ChannelList::insert(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
    }
  }
  if ((local_c & 8) != 0) {
    Channel::Channel((Channel *)&stack0xffffffffffffff44,HALF,1,1,false);
    ChannelList::insert(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
  }
  pCVar1 = Header::channels((Header *)0x21f17d);
  ChannelList::operator=(in_stack_ffffffffffffff40,pCVar1);
  ChannelList::~ChannelList((ChannelList *)0x21f1a3);
  return;
}

Assistant:

void
insertChannels (Header& header, RgbaChannels rgbaChannels)
{
    ChannelList ch;

    if (rgbaChannels & (WRITE_Y | WRITE_C))
    {
        if (rgbaChannels & WRITE_Y) { ch.insert ("Y", Channel (HALF, 1, 1)); }

        if (rgbaChannels & WRITE_C)
        {
            ch.insert ("RY", Channel (HALF, 2, 2, true));
            ch.insert ("BY", Channel (HALF, 2, 2, true));
        }
    }
    else
    {
        if (rgbaChannels & WRITE_R) ch.insert ("R", Channel (HALF, 1, 1));

        if (rgbaChannels & WRITE_G) ch.insert ("G", Channel (HALF, 1, 1));

        if (rgbaChannels & WRITE_B) ch.insert ("B", Channel (HALF, 1, 1));
    }

    if (rgbaChannels & WRITE_A) ch.insert ("A", Channel (HALF, 1, 1));

    header.channels () = ch;
}